

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::MILSpec::Block::Clear(Block *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
            (&(this->inputs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->outputs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::TypeHandler>
            (&(this->operations_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::clear(&(this->attributes_).map_);
  return;
}

Assistant:

void Block::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Block)
  inputs_.Clear();
  outputs_.Clear();
  operations_.Clear();
  attributes_.Clear();
}